

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O2

bool __thiscall
embree::motion_derivative_regression_test::run(motion_derivative_regression_test *this)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int i;
  long lVar5;
  int j;
  int k;
  int iVar6;
  int iVar7;
  float fVar8;
  float __x;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  uint numRoots;
  undefined4 uStack_4d4;
  undefined8 uStack_4d0;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_4c8;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [12];
  float fStack_48c;
  undefined1 local_488 [12];
  float fStack_47c;
  undefined1 local_478 [16];
  AffineSpace3fa M1;
  Vec3fa axis;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3b8 [2];
  unsigned_long local_398;
  unsigned_long uStack_390;
  unsigned_long local_388;
  unsigned_long uStack_380;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  float roots [32];
  MotionDerivativeCoefficients local_2d8;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&this->rng,0xb1413fa1);
  local_2d8.theta = -2.0;
  local_2d8.coeffs[0] = 2.0;
  numRoots = 0;
  MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
            ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
  if (((numRoots == 2) && (ABS(roots[0] + 1.0) <= 1e+06)) && (ABS(roots[1] + -1.0) <= 1e+06)) {
    local_2d8.theta = -2.0;
    local_2d8.coeffs[0] = 2.0;
    numRoots = 0;
    MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
              ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
    if (numRoots == 2) {
      local_2d8.theta = -2.0;
      local_2d8.coeffs[0] = 2.0;
      numRoots = 0;
      MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
      if (numRoots == 3) {
        local_2d8.theta = 0.5;
        local_2d8.coeffs[0] = 1.4;
        numRoots = 0;
        MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                  ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
        if (numRoots == 3) {
          local_2d8.theta = 0.0;
          local_2d8.coeffs[0] = 7.0;
          numRoots = 0;
          MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                    ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
          if (numRoots == 7) {
            local_2d8.theta = 0.0;
            local_2d8.coeffs[0] = 7.0;
            numRoots = 0;
            MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                      ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
            if (numRoots == 7) {
              local_2d8.theta = 0.0;
              local_2d8.coeffs[0] = 2.0;
              _numRoots = (ulong)(uint)uStack_4d4 << 0x20;
              MotionDerivative::
              findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                        ((EvalFunc *)&M1,(Interval1f *)&local_2d8,&numRoots,roots,0x20);
              if (numRoots == 7) {
                lVar5 = 0;
                do {
                  if (lVar5 == 7) {
                    iVar6 = 0x41;
                    do {
                      iVar6 = iVar6 + -1;
                      if (iVar6 == 0) {
                        iVar6 = 0;
                        do {
                          if (iVar6 == 0x40) {
                            return true;
                          }
                          random_axis((motion_derivative_regression_test *)&axis);
                          fVar8 = rand01(this);
                          fVar8 = (fVar8 + fVar8 + -1.0) * 6.2831855;
                          __x = fVar8 * 0.5;
                          iVar7 = 0;
                          while (iVar7 != 0x10) {
                            fVar12 = (float)iVar7;
                            fVar9 = powf(0.1,fVar12);
                            _local_488 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                                         ZEXT416((uint)axis.field_0.m128[0]);
                            local_478 = ZEXT416((uint)axis.field_0.m128[1]);
                            local_498._0_4_ = axis.field_0.m128[2];
                            fVar10 = cosf(__x);
                            fVar11 = sinf(__x);
                            fVar18 = local_488._0_4_;
                            auVar13._4_12_ = local_488._4_12_;
                            auVar13._0_4_ =
                                 fVar18 * fVar18 +
                                 (float)local_478._0_4_ * (float)local_478._0_4_ +
                                 (float)local_498._0_4_ * (float)local_498._0_4_;
                            auVar14._4_4_ = local_488._4_4_;
                            auVar14._0_4_ = auVar13._0_4_;
                            auVar14._8_4_ = local_488._8_4_;
                            auVar14._12_4_ = local_488._12_4_;
                            auVar15 = rsqrtss(auVar14,auVar13);
                            fVar17 = auVar15._0_4_;
                            register0x00001304 = auVar15._4_12_;
                            fVar17 = fVar17 * 1.5 - fVar17 * fVar17 * auVar13._0_4_ * 0.5 * fVar17;
                            local_488._0_4_ = fVar18 * fVar17 * fVar11;
                            local_478._0_4_ = (float)local_478._0_4_ * fVar17 * fVar11;
                            local_498._0_4_ = fVar17 * (float)local_498._0_4_ * fVar11;
                            local_368 = ZEXT416((uint)axis.field_0.m128[0]);
                            local_378 = ZEXT416((uint)axis.field_0.m128[1]);
                            uVar3 = axis.field_0.m128[2];
                            unique0x100011ac = auVar13._4_12_;
                            fVar11 = rand01(this);
                            fVar11 = ((float)(~-(uint)(0.5 < fVar11) & (uint)fVar12 |
                                             (uint)-fVar12 & -(uint)(0.5 < fVar11)) * fVar9 + fVar8)
                                     * 0.5;
                            fVar9 = cosf(fVar11);
                            fVar11 = sinf(fVar11);
                            uVar2 = local_488._0_4_;
                            local_4b8._12_4_ = local_498._0_4_;
                            fVar17 = (float)local_368._0_4_ * (float)local_368._0_4_ +
                                     (float)local_378._0_4_ * (float)local_378._0_4_ +
                                     (float)uVar3 * (float)uVar3;
                            auVar16._4_4_ = local_368._4_4_;
                            auVar16._0_4_ = fVar17;
                            auVar16._8_4_ = local_368._8_4_;
                            auVar16._12_4_ = local_368._12_4_;
                            auVar15._4_4_ = local_368._4_4_;
                            auVar15._0_4_ = fVar17;
                            auVar15._8_4_ = local_368._8_4_;
                            auVar15._12_4_ = local_368._12_4_;
                            auVar15 = rsqrtss(auVar16,auVar15);
                            fVar12 = auVar15._0_4_;
                            fVar12 = fVar12 * 1.5 - fVar12 * fVar12 * fVar17 * 0.5 * fVar12;
                            local_4c8.m128[3] = (float)local_478._0_4_;
                            M1.l.vy.field_0._0_12_ = ZEXT812(0x3f80000000000000);
                            M1.l.vy.field_0.m128[3] = (float)local_378._0_4_ * fVar12 * fVar11;
                            M1.l.vx.field_0._0_8_ = 0x3f800000;
                            M1.l.vx.field_0._8_8_ =
                                 (ulong)(uint)((float)local_368._0_4_ * fVar12 * fVar11) << 0x20;
                            M1.l.vz.field_0._0_8_ = 0;
                            M1.l.vz.field_0.m128[3] = fVar12 * (float)uVar3 * fVar11;
                            M1.l.vz.field_0.m128[2] = 1.0;
                            M1.p.field_0.field_1 =
                                 (anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1
                                  )ZEXT812(0);
                            M1.p.field_0.m128[3] = fVar9;
                            _numRoots = 0x3f800000;
                            uStack_4d0 = (ulong)(uint)local_488._0_4_ << 0x20;
                            local_498 = ZEXT812(0x3f80000000000000);
                            fStack_48c = local_4c8.m128[3];
                            local_4c8.m128[0] = 0.0;
                            local_4c8.m128[1] = 1.0;
                            local_4c8.m128[2] = 0.0;
                            local_478._0_12_ = ZEXT412(0x3f800000) << 0x40;
                            local_478._12_4_ = local_4b8._12_4_;
                            local_4b8._0_8_ = 0;
                            local_4b8._8_4_ = 0x3f800000;
                            local_488 = ZEXT812(0);
                            fStack_47c = fVar10;
                            local_4a8._0_12_ = ZEXT812(0);
                            local_4a8._12_4_ = fVar10;
                            MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                      (&local_2d8,(AffineSpace3ff *)&numRoots,(AffineSpace3ff *)&M1)
                            ;
                            bVar4 = testMDC(this,&local_2d8);
                            if (!bVar4) {
                              return false;
                            }
                            _numRoots = 0x3f800000;
                            uStack_4d0 = (ulong)(uint)uVar2 << 0x20;
                            local_4c8.m128[0] = local_498._0_4_;
                            local_4c8.m128[1] = local_498._4_4_;
                            local_4c8.m128[2] = local_498._8_4_;
                            local_4c8.m128[3] = local_498._12_4_;
                            local_4b8._0_8_ = local_478._0_8_;
                            local_4b8._8_8_ = local_478._8_8_;
                            local_4a8 = (undefined1  [16])_local_488;
                            M1.l.vy.field_0 = _local_498;
                            M1.l.vz.field_0._0_8_ = local_478._0_8_;
                            M1.l.vz.field_0._8_8_ = local_478._8_8_;
                            M1.p.field_0 = _local_488;
                            M1.l.vx.field_0._0_8_ = _numRoots;
                            M1.l.vx.field_0._8_8_ = uStack_4d0;
                            MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                      (&local_2d8,(AffineSpace3ff *)&numRoots,(AffineSpace3ff *)&M1)
                            ;
                            bVar4 = testMDC(this,&local_2d8);
                            iVar7 = iVar7 + 1;
                            if (!bVar4) {
                              return false;
                            }
                          }
                          iVar6 = iVar6 + 1;
                        } while( true );
                      }
                      random_quaternion_decomposition((AffineSpace3fa *)&numRoots,this);
                      random_quaternion_decomposition(&M1,this);
                      axis.field_0._0_8_ = _numRoots;
                      axis.field_0._8_8_ = uStack_4d0;
                      local_3b8[0]._0_8_ = M1.l.vx.field_0._0_8_;
                      local_3b8[0]._8_8_ = M1.l.vx.field_0._8_8_;
                      local_398 = M1.l.vz.field_0._0_8_;
                      uStack_390 = M1.l.vz.field_0._8_8_;
                      local_388 = M1.p.field_0._0_8_;
                      uStack_380 = M1.p.field_0._8_8_;
                      MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                (&local_2d8,(AffineSpace3ff *)&axis,
                                 (AffineSpace3ff *)&local_3b8[0].field_1);
                      bVar4 = testMDC(this,&local_2d8);
                      if (!bVar4) {
                        return false;
                      }
                      axis.field_0._0_8_ = _numRoots;
                      axis.field_0._8_8_ = uStack_4d0;
                      local_3b8[0]._0_8_ = _numRoots;
                      local_3b8[0]._8_8_ = uStack_4d0;
                      local_398 = local_4b8._0_8_;
                      uStack_390 = local_4b8._8_8_;
                      local_388 = local_4a8._0_8_;
                      uStack_380 = local_4a8._8_8_;
                      MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                (&local_2d8,(AffineSpace3ff *)&axis,
                                 (AffineSpace3ff *)&local_3b8[0].field_1);
                      bVar4 = testMDC(this,&local_2d8);
                    } while (bVar4);
                    return false;
                  }
                  pfVar1 = roots + lVar5;
                  iVar6 = (int)lVar5;
                  lVar5 = lVar5 + 1;
                } while (ABS(((float)iVar6 * -3.1415927) / 10.0 + *pfVar1) <= 1e-06);
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool run ()
    {
      bool passed = true;
#if 0
      std::random_device device;
      size_t seed = device();
#else
      // tests fails for this seed if MOTION_DERIVATIVE_ROOT_EPSILON is 1e-6f instead of 1e-4f
      size_t seed = 2973843361;
#endif
      rng.seed(seed);

      ////////////////////////////////////////////////////////////////////////////////
      // test root solver
      ////////////////////////////////////////////////////////////////////////////////
      unsigned int maxNumRoots = 32;
      float roots[32];
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
            return (t - 1.0) * (t + 1.0);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 2) return false;
        if (abs(roots[0]+1.f) > 1e6f) return false;
        if (abs(roots[1]-1.f) > 1e6f) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.99999f);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 2) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.9999f);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 3) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (-7.831048f) + (70.619041f) + (-116.007454f) * t
            + ((-198.235809f) + ( 411.193054f) * t + (-160.020020f) * t * t) * cos(5.438017f * t)
            + ((-320.571472f) + ( 786.181946f) * t + (-559.993164f) * t * t) * sin(5.438017f * t);
        }};
        Interval1f I(0.5, 1.4f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 3) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(t) * cos(t-1.0f) * 50 * (t-2.0f) * (t-4.0f);
        }};
        Interval1f I(0.0, 7.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(t) * cos(t-1) * 0.0000001f * (t-2.0f) * (t-4.0f);
        }};
        Interval1f I(0.0, 7.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
      }
      {
        // all roots are of the form n*PI/10 for n = 0, 1, 2, ...
        // the function values vary from 0 to 3000
        // in a plot everything from 0 to 0.5 looks like constant zero
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(10.0f * t) * 100.0f * t*t*t*t*t;
        }};
        Interval1f I(0.0, 2.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
        for (int i = 0; i < 7; ++i) {
          if (abs(roots[i]-(i*M_PI)/10.f) > 1e-6f)
            return false;
        }
      }

      ////////////////////////////////////////////////////////////////////////////////
      // test motion derivative coefficients
      ////////////////////////////////////////////////////////////////////////////////
      const size_t numTests = 64;

      // test completely random transformations
      for (int j = 0; j < numTests; ++j)
      {
        AffineSpace3fa M0 = random_quaternion_decomposition();
        AffineSpace3fa M1 = random_quaternion_decomposition();
        if (!testMDC(MotionDerivativeCoefficients(M0, M1))) return false;
        if (!testMDC(MotionDerivativeCoefficients(M0, M0))) return false;
      }

      // test transformations with slightly different rotation angles
      for (int j = 0; j < numTests; ++j)
      {
        Vec3fa axis = random_axis();
        float angle = 2.f * M_PI * (2.f * rand01() - 1.f);
        AffineSpace3fa S(one);
        Vec3fa T(0.f);

        for (int k = 0; k < 16; ++k)
        {
          float eps = pow(0.1f, k);
          Quaternion3f q0 = Quaternion3f::rotate(axis, angle);
          Quaternion3f q1 = Quaternion3f::rotate(axis, angle + (rand01() > 0.5f ? -1.f : 1.f) * k * eps);
          AffineSpace3fa M0 = quaternionDecomposition(T, q0, S);
          AffineSpace3fa M1 = quaternionDecomposition(T, q1, S);
          if (!testMDC(MotionDerivativeCoefficients(M0, M1))) return false;
          if (!testMDC(MotionDerivativeCoefficients(M0, M0))) return false;
        }
      }


      return passed;
    }